

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

void __thiscall svg::Color::Color(Color *this,Defaults color)

{
  int iVar1;
  undefined8 uVar2;
  
  (this->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Serializeable_00112ce0;
  this->transparent = false;
  this->red = 0;
  this->green = 0;
  this->blue = 0;
  switch(color) {
  case Aqua:
  case Cyan:
    uVar2 = 0xff000000ff;
    break;
  case Black:
    this->green = 0;
    return;
  case Blue:
    uVar2 = 0xff00000000;
    break;
  case Brown:
    this->red = 0xa5;
    this->green = 0x2a;
    this->blue = 0x2a;
    return;
  case Fuchsia:
  case Magenta:
    iVar1 = 0xff;
    goto LAB_0010ba3d;
  case Green:
    this->green = 0x80;
    return;
  case Lime:
    this->green = 0xff;
    return;
  case Orange:
    uVar2 = 0xa5000000ff;
    goto LAB_0010b9e6;
  case Purple:
    iVar1 = 0x80;
LAB_0010ba3d:
    this->red = iVar1;
    this->blue = iVar1;
    return;
  case Red:
    this->red = 0xff;
    this->blue = 0;
    return;
  case Silver:
    this->red = 0xc0;
    this->green = 0xc0;
    this->blue = 0xc0;
    return;
  case White:
    this->red = 0xff;
    this->green = 0xff;
    this->blue = 0xff;
    return;
  case Yellow:
    uVar2 = 0xff000000ff;
LAB_0010b9e6:
    this->red = (int)uVar2;
    this->green = (int)((ulong)uVar2 >> 0x20);
    return;
  default:
    this->transparent = true;
    return;
  }
  this->green = (int)uVar2;
  this->blue = (int)((ulong)uVar2 >> 0x20);
  return;
}

Assistant:

Color(Defaults color)
            : transparent(false), red(0), green(0), blue(0)
        {
            switch (color)
            {
                case Aqua: assign(0, 255, 255); break;
                case Black: assign(0, 0, 0); break;
                case Blue: assign(0, 0, 255); break;
                case Brown: assign(165, 42, 42); break;
                case Cyan: assign(0, 255, 255); break;
                case Fuchsia: assign(255, 0, 255); break;
                case Green: assign(0, 128, 0); break;
                case Lime: assign(0, 255, 0); break;
                case Magenta: assign(255, 0, 255); break;
                case Orange: assign(255, 165, 0); break;
                case Purple: assign(128, 0, 128); break;
                case Red: assign(255, 0, 0); break;
                case Silver: assign(192, 192, 192); break;
                case White: assign(255, 255, 255); break;
                case Yellow: assign(255, 255, 0); break;
                default: transparent = true; break;
            }
        }